

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O1

void c352_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  size_t __n;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  DEV_SMPL *pDVar7;
  DEV_SMPL *pDVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ushort uVar18;
  ulong uVar19;
  short sVar20;
  uint uVar21;
  
  __n = (ulong)samples * 4;
  uVar19 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0) {
    cVar2 = *(char *)((long)chip + 0x4a0);
    do {
      iVar12 = 0;
      lVar14 = 0x2c;
      iVar13 = 0;
      iVar10 = 0;
      iVar11 = 0;
      do {
        uVar18 = *(ushort *)((long)chip + lVar14 + -10);
        iVar16 = 0;
        if ((short)uVar18 < 0) {
          uVar5 = *(uint *)((long)chip + lVar14 + -0x1c);
          uVar15 = *(ushort *)((long)chip + lVar14 + -0xc) + uVar5;
          if ((uVar15 >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)chip + lVar14 + -0x16) =
                 *(undefined2 *)((long)chip + lVar14 + -0x18);
            if ((uVar18 & 0x10) == 0) {
              uVar6 = *(uint *)((long)chip + lVar14 + -0x20);
              bVar3 = *(byte *)(*(long *)((long)chip + 0x490) +
                               (ulong)(*(uint *)((long)chip + 0x49c) & uVar6));
              if ((uVar18 & 8) == 0) {
                sVar20 = (ushort)bVar3 << 8;
              }
              else {
                sVar20 = *(short *)((long)chip + (ulong)bVar3 * 2 + 0x4a2);
              }
              *(short *)((long)chip + lVar14 + -0x18) = sVar20;
              uVar21 = ~(uint)uVar18;
              sVar20 = (short)uVar6;
              if ((uVar21 & 3) == 0) {
                if (((uVar18 & 0x40) == 0) || (*(short *)((long)chip + lVar14 + -2) != sVar20)) {
                  if (((uVar18 & 0x40) == 0) && (*(short *)((long)chip + lVar14 + -4) == sVar20)) {
                    uVar18 = uVar18 | 0x40;
                    goto LAB_0016e812;
                  }
                }
                else {
                  uVar18 = uVar18 & 0xffbf;
LAB_0016e812:
                  *(ushort *)((long)chip + lVar14 + -10) = uVar18;
                }
                *(uint *)((long)chip + lVar14 + -0x20) =
                     (-(*(ushort *)((long)chip + lVar14 + -10) >> 6 & 1) | 1) + uVar6;
              }
              else if (*(short *)((long)chip + lVar14 + -4) == sVar20) {
                if ((uVar21 & 0x22) == 0) {
                  *(uint *)((long)chip + lVar14 + -0x20) =
                       CONCAT22(*(undefined2 *)((long)chip + lVar14 + -6),
                                *(undefined2 *)((long)chip + lVar14 + -2));
                }
                else {
                  if ((uVar18 & 2) == 0) {
                    *(ushort *)((long)chip + lVar14 + -10) = uVar18 & 0x5ffd | 0x2000;
                    *(undefined2 *)((long)chip + lVar14 + -0x18) = 0;
                    goto LAB_0016e88b;
                  }
                  *(uint *)((long)chip + lVar14 + -0x20) =
                       (uint)*(ushort *)((long)chip + lVar14 + -2) | uVar6 & 0xff0000;
                }
                *(ushort *)((long)chip + lVar14 + -10) = uVar18 | 0x800;
              }
              else {
                *(uint *)((long)chip + lVar14 + -0x20) = uVar6 + (-(uVar18 & 1) | 1);
              }
            }
            else {
              uVar18 = -(*(ushort *)((long)chip + 0x48c) & 1) & 0xfff6 ^
                       *(ushort *)((long)chip + 0x48c) >> 1;
              *(ushort *)((long)chip + 0x48c) = uVar18;
              *(ushort *)((long)chip + lVar14 + -0x18) = uVar18;
            }
          }
LAB_0016e88b:
          if (((uVar5 ^ uVar15) & 0x18000) != 0) {
            bVar3 = *(byte *)((long)chip + lVar14 + -0x13);
            bVar4 = *(byte *)((long)chip + lVar14 + -0x10);
            if (bVar4 != bVar3) {
              *(byte *)((long)chip + lVar14 + -0x10) = (-(bVar3 < bVar4) | 1U) + bVar4;
            }
            bVar3 = *(byte *)((long)chip + lVar14 + -0x14);
            bVar4 = *(byte *)((long)chip + lVar14 + -0xf);
            if (bVar4 != bVar3) {
              *(byte *)((long)chip + lVar14 + -0xf) = (-(bVar3 < bVar4) | 1U) + bVar4;
            }
            bVar3 = *(byte *)((long)chip + lVar14 + -0x11);
            bVar4 = *(byte *)((long)chip + lVar14 + -0xe);
            if (bVar4 != bVar3) {
              *(byte *)((long)chip + lVar14 + -0xe) = (-(bVar3 < bVar4) | 1U) + bVar4;
            }
            bVar3 = *(byte *)((long)chip + lVar14 + -0x12);
            bVar4 = *(byte *)((long)chip + lVar14 + -0xd);
            if (bVar4 != bVar3) {
              *(byte *)((long)chip + lVar14 + -0xd) = (-(bVar3 < bVar4) | 1U) + bVar4;
            }
          }
          *(uint *)((long)chip + lVar14 + -0x1c) = uVar15 & 0xffff;
          if ((*(byte *)((long)chip + lVar14 + -10) & 4) == 0) {
            sVar20 = *(short *)((long)chip + lVar14 + -0x16);
            iVar16 = (int)(((long)*(short *)((long)chip + lVar14 + -0x18) - (long)sVar20) *
                           (ulong)(uVar15 & 0xffff) >> 0x10) + (int)sVar20;
          }
          else {
            iVar16 = (int)*(short *)((long)chip + lVar14 + -0x18);
          }
        }
        if (*(char *)((long)chip + lVar14) == '\0') {
          uVar18 = *(ushort *)((long)chip + lVar14 + -10);
          iVar17 = -iVar16;
          iVar9 = iVar17;
          if ((uVar18 >> 8 & 1) == 0) {
            iVar9 = iVar16;
          }
          iVar12 = iVar12 + ((int)((uint)*(byte *)((long)chip + lVar14 + -0x10) * iVar9) >> 8);
          iVar9 = iVar17;
          if ((uVar18 >> 9 & 1) == 0) {
            iVar9 = iVar16;
          }
          iVar10 = iVar10 + ((int)((uint)*(byte *)((long)chip + lVar14 + -0xe) * iVar9) >> 8);
          if (-1 < (char)uVar18) {
            iVar17 = iVar16;
          }
          iVar13 = iVar13 + ((int)((uint)*(byte *)((long)chip + lVar14 + -0xf) * iVar17) >> 8);
          iVar11 = iVar11 + ((int)((uint)*(byte *)((long)chip + lVar14 + -0xd) * iVar17) >> 8);
        }
        lVar14 = lVar14 + 0x24;
      } while (lVar14 != 0x4ac);
      pDVar7 = *outputs;
      piVar1 = pDVar7 + uVar19;
      *piVar1 = *piVar1 + iVar12;
      pDVar8 = outputs[1];
      piVar1 = pDVar8 + uVar19;
      *piVar1 = *piVar1 + iVar13;
      if ((cVar2 == '\0') && (*(char *)((long)chip + 0x4a1) == '\0')) {
        piVar1 = pDVar7 + uVar19;
        *piVar1 = *piVar1 + iVar10;
        piVar1 = pDVar8 + uVar19;
        *piVar1 = *piVar1 + iVar11;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != samples);
  }
  return;
}

Assistant:

static void c352_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	C352 *c = (C352 *)chip;
	UINT32 i, j;
	INT32 s;
	INT32 next_counter;
	C352_Voice* v;

	DEV_SMPL out[4];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	for(i=0;i<samples;i++)
	{
		out[0]=out[1]=out[2]=out[3]=0;

		for(j=0;j<C352_VOICES;j++)
		{

			v = &c->v[j];
			s = 0;

			if(v->flags & C352_FLG_BUSY)
			{
				next_counter = v->counter+v->freq;

				if(next_counter & 0x10000)
				{
					C352_fetch_sample(c,v);
				}

				if((next_counter^v->counter) & 0x18000)
				{
					c352_ramp_volume(v,0,v->vol_f>>8);
					c352_ramp_volume(v,1,v->vol_f&0xff);
					c352_ramp_volume(v,2,v->vol_r>>8);
					c352_ramp_volume(v,3,v->vol_r&0xff);
				}

				v->counter = next_counter&0xffff;

				// Interpolate samples
				if((v->flags & C352_FLG_FILTER) == 0)
					s = v->last_sample + (INT32)((INT64)v->counter*(v->sample-v->last_sample)>>16);
				else
					s = v->sample;
			}

			if(!c->v[j].mute)
			{
				// Left
				out[0] += (((v->flags & C352_FLG_PHASEFL) ? -s : s) * v->curr_vol[0])>>8;
				out[2] += (((v->flags & C352_FLG_PHASERL) ? -s : s) * v->curr_vol[2])>>8;

				// Right
				out[1] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[1])>>8;
				out[3] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[3])>>8;
			}
		}

		outputs[0][i] += out[0];
		outputs[1][i] += out[1];
		if (!c->muteRear && !c->optMuteRear)
		{
			outputs[0][i] += out[2];
			outputs[1][i] += out[3];
		}
	}
}